

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxBinaryLogical::Resolve(FxBinaryLogical *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PString *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxBoolCast *pFVar4;
  FxExpression *pFVar5;
  FxConstant *this_00;
  _func_int **pp_Var6;
  bool val;
  FScriptPosition *pFVar7;
  uint uVar8;
  uint uVar9;
  FString local_38;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar5 = this->left;
  if (pFVar5 != (FxExpression *)0x0) {
    iVar3 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
    this->left = (FxExpression *)CONCAT44(extraout_var,iVar3);
  }
  pFVar5 = this->right;
  if (pFVar5 != (FxExpression *)0x0) {
    iVar3 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
    this->right = (FxExpression *)CONCAT44(extraout_var_00,iVar3);
  }
  if ((this->right == (FxExpression *)0x0) || (this->left == (FxExpression *)0x0)) {
LAB_0052d383:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  if (this->left->ValueType != (PType *)TypeBool) {
    pFVar4 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar5 = this->left;
    (pFVar4->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              (&(pFVar4->super_FxExpression).ScriptPosition,&pFVar5->ScriptPosition);
    (pFVar4->super_FxExpression).ValueType = (PType *)0x0;
    (pFVar4->super_FxExpression).isresolved = false;
    (pFVar4->super_FxExpression).NeedResult = true;
    (pFVar4->super_FxExpression).ExprType = EFX_BoolCast;
    (pFVar4->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070f548;
    pFVar4->basex = pFVar5;
    (pFVar4->super_FxExpression).ValueType = (PType *)TypeBool;
    pFVar4->NeedValue = true;
    this->left = (FxExpression *)pFVar4;
    pFVar5 = FxBoolCast::Resolve(pFVar4,ctx);
    this->left = pFVar5;
    if (pFVar5 == (FxExpression *)0x0) goto LAB_0052d383;
  }
  if (this->right->ValueType != (PType *)TypeBool) {
    pFVar4 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar5 = this->right;
    (pFVar4->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              (&(pFVar4->super_FxExpression).ScriptPosition,&pFVar5->ScriptPosition);
    (pFVar4->super_FxExpression).ValueType = (PType *)0x0;
    (pFVar4->super_FxExpression).isresolved = false;
    (pFVar4->super_FxExpression).NeedResult = true;
    (pFVar4->super_FxExpression).ExprType = EFX_BoolCast;
    (pFVar4->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070f548;
    pFVar4->basex = pFVar5;
    (pFVar4->super_FxExpression).ValueType = (PType *)TypeBool;
    pFVar4->NeedValue = true;
    this->right = (FxExpression *)pFVar4;
    pFVar5 = FxBoolCast::Resolve(pFVar4,ctx);
    this->right = pFVar5;
    if (pFVar5 == (FxExpression *)0x0) goto LAB_0052d383;
  }
  iVar3 = (*this->left->_vptr_FxExpression[3])();
  uVar8 = 0xffffffff;
  uVar9 = 0xffffffff;
  if ((char)iVar3 != '\0') {
    pPVar2 = (PString *)this->left[1]._vptr_FxExpression;
    pFVar7 = &this->left[1].ScriptPosition;
    if (pPVar2 == TypeString) {
      FString::AttachToOther(&local_38,&pFVar7->FileName);
    }
    else {
      local_38.Chars = (pFVar7->FileName).Chars;
    }
    BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      uVar9 = -(uint)((double)local_38.Chars != 0.0) & 1;
    }
    else if (BVar1 == '\0') {
      uVar9 = (uint)((int)local_38.Chars != 0);
    }
    else {
      uVar9 = 0;
    }
    if (pPVar2 == TypeString) {
      FString::~FString(&local_38);
    }
  }
  iVar3 = (*this->right->_vptr_FxExpression[3])();
  if ((char)iVar3 != '\0') {
    pPVar2 = (PString *)this->right[1]._vptr_FxExpression;
    pFVar7 = &this->right[1].ScriptPosition;
    if (pPVar2 == TypeString) {
      FString::AttachToOther(&local_38,&pFVar7->FileName);
    }
    else {
      local_38.Chars = (pFVar7->FileName).Chars;
    }
    BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      uVar8 = -(uint)((double)local_38.Chars != 0.0) & 1;
    }
    else if (BVar1 == '\0') {
      uVar8 = (uint)((int)local_38.Chars != 0);
    }
    else {
      uVar8 = 0;
    }
    if (pPVar2 == TypeString) {
      FString::~FString(&local_38);
    }
  }
  if (this->Operator == 0x11c) {
    if ((uVar9 == 1) || (uVar8 == 1)) goto LAB_0052d4e8;
    if (uVar8 != 0 || uVar9 != 0) {
      if (uVar9 == 0) {
LAB_0052d53d:
        pp_Var6 = (this->super_FxExpression)._vptr_FxExpression;
        this_00 = (FxConstant *)this->right;
        this->right = (FxExpression *)0x0;
        goto LAB_0052d52f;
      }
      if (uVar8 != 0) goto LAB_0052d4db;
LAB_0052d4af:
      pp_Var6 = (this->super_FxExpression)._vptr_FxExpression;
      this_00 = (FxConstant *)this->left;
      this->left = (FxExpression *)0x0;
      goto LAB_0052d52f;
    }
LAB_0052d50a:
    this_00 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
    val = false;
  }
  else {
    if (this->Operator != 0x11b) {
LAB_0052d4db:
      Flatten(this);
      return &this->super_FxExpression;
    }
    if ((uVar9 != 0) && (uVar8 != 0)) {
      if ((uVar9 == 1) && (uVar8 == 1)) goto LAB_0052d50a;
      if (uVar9 == 1) goto LAB_0052d53d;
      if (uVar8 != 1) goto LAB_0052d4db;
      goto LAB_0052d4af;
    }
LAB_0052d4e8:
    this_00 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
    val = true;
  }
  FxConstant::FxConstant(this_00,val,&(this->super_FxExpression).ScriptPosition);
  pp_Var6 = (this->super_FxExpression)._vptr_FxExpression;
LAB_0052d52f:
  (*pp_Var6[1])(this);
  return &this_00->super_FxExpression;
}

Assistant:

FxExpression *FxBinaryLogical::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	ABORT(right && left);

	if (left->ValueType != TypeBool)
	{
		left = new FxBoolCast(left);
		SAFE_RESOLVE(left, ctx);
	}
	if (right->ValueType != TypeBool)
	{
		right = new FxBoolCast(right);
		SAFE_RESOLVE(right, ctx);
	}

	int b_left=-1, b_right=-1;
	if (left->isConstant()) b_left = static_cast<FxConstant *>(left)->GetValue().GetBool();
	if (right->isConstant()) b_right = static_cast<FxConstant *>(right)->GetValue().GetBool();

	// Do some optimizations. This will throw out all sub-expressions that are not
	// needed to retrieve the final result.
	if (Operator == TK_AndAnd)
	{
		if (b_left==0 || b_right==0)
		{
			FxExpression *x = new FxConstant(true, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==1 && b_right==1)
		{
			FxExpression *x = new FxConstant(false, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==1)
		{
			FxExpression *x = right;
			right=nullptr;
			delete this;
			return x;
		}
		else if (b_right==1)
		{
			FxExpression *x = left;
			left=nullptr;
			delete this;
			return x;
		}
	}
	else if (Operator == TK_OrOr)
	{
		if (b_left==1 || b_right==1)
		{
			FxExpression *x = new FxConstant(true, ScriptPosition);
			delete this;
			return x;
		}
		if (b_left==0 && b_right==0)
		{
			FxExpression *x = new FxConstant(false, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==0)
		{
			FxExpression *x = right;
			right=nullptr;
			delete this;
			return x;
		}
		else if (b_right==0)
		{
			FxExpression *x = left;
			left=nullptr;
			delete this;
			return x;
		}
	}
	Flatten();
	return this;
}